

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QMarginsF *m)

{
  QDebug *other;
  QDebugStateSaver *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff9f;
  QDebugStateSaver *in_stack_ffffffffffffffa0;
  Stream *margins;
  QDebug *in_stack_ffffffffffffffc8;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  margins = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_RSI,(QDebug *)in_RDI);
  QDebug::nospace((QDebug *)in_RSI);
  other = QDebug::operator<<(in_stack_ffffffffffffffc8,t);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  QtDebugUtils::formatQMargins<QMarginsF>((QDebug *)in_RSI,(QMarginsF *)margins);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  QDebug::QDebug((QDebug *)in_RDI,other);
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffffa0);
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return (QDebug)margins;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QMarginsF &m)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QMarginsF" << '(';
    QtDebugUtils::formatQMargins(dbg, m);
    dbg << ')';
    return dbg;
}